

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgr.hpp
# Opt level: O0

sgr * cpp_sgr::operator+(sgr *__return_storage_ptr__,sgr *left,sgr *right)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  sgr *right_local;
  sgr *left_local;
  
  local_20 = &right->str;
  right_local = left;
  left_local = __return_storage_ptr__;
  std::operator+(&local_60,&left->str,";");
  std::operator+(&local_40,&local_60,local_20);
  sgr::sgr(__return_storage_ptr__,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  return __return_storage_ptr__;
}

Assistant:

sgr operator+(const sgr & left, const sgr & right)
		{
			return sgr(left.str + ";" + right.str);
		}